

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_abs_i32_tricore(TCGContext_conflict9 *tcg_ctx,TCGv_i32 ret,TCGv_i32 a)

{
  TCGv_i32 ret_00;
  uintptr_t o;
  
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_sari_i32_tricore(tcg_ctx,ret_00,a,0x1f);
  tcg_gen_xor_i32(tcg_ctx,ret,a,ret_00);
  tcg_gen_sub_i32(tcg_ctx,ret,ret,ret_00);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_abs_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 a)
{
    TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_sari_i32(tcg_ctx, t, a, 31);
    tcg_gen_xor_i32(tcg_ctx, ret, a, t);
    tcg_gen_sub_i32(tcg_ctx, ret, ret, t);
    tcg_temp_free_i32(tcg_ctx, t);
}